

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O3

void extendResult(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *result,vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          *contents)

{
  cmGeneratorExpressionEvaluator *pcVar1;
  int iVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  
  ppcVar5 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppcVar4 = (result->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar4) {
    iVar2 = (*ppcVar4[-1]->_vptr_cmGeneratorExpressionEvaluator[2])();
    if (iVar2 == 0) {
      iVar2 = (*(*(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_vptr_cmGeneratorExpressionEvaluator
                [2])();
      ppcVar5 = (result->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2 == 0) {
        pcVar1 = *(contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppcVar5[-1][2]._vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)
             ((long)ppcVar5[-1][2]._vptr_cmGeneratorExpressionEvaluator +
             (long)pcVar1[2]._vptr_cmGeneratorExpressionEvaluator);
        (*pcVar1->_vptr_cmGeneratorExpressionEvaluator[1])();
        ppcVar5 = (result->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppcVar3 = (contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppcVar4 = (contents->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1;
        goto LAB_003d93fe;
      }
    }
    else {
      ppcVar5 = (result->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  ppcVar4 = (contents->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppcVar3 = (contents->
            super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
LAB_003d93fe:
  std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>
            ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
              *)result,ppcVar5,ppcVar4,ppcVar3);
  return;
}

Assistant:

static void extendResult(std::vector<cmGeneratorExpressionEvaluator*> &result,
                const std::vector<cmGeneratorExpressionEvaluator*> &contents)
{
  if (!result.empty()
      && (*(result.end() - 1))->GetType()
                                  == cmGeneratorExpressionEvaluator::Text
      && (*contents.begin())->GetType()
                                  == cmGeneratorExpressionEvaluator::Text)
  {
    TextContent *textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(
                  static_cast<TextContent*>(*contents.begin())->GetLength());
    delete *contents.begin();
    result.insert(result.end(), contents.begin() + 1, contents.end());
  } else {
    result.insert(result.end(), contents.begin(), contents.end());
  }
}